

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Type,_8UL>::reserve
          (ArrayWithPreallocation<soul::Type,_8UL> *this,size_t minSize)

{
  Type *pTVar1;
  Type *pTVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->numAllocated < minSize) {
    uVar3 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar3 != 0) {
      pTVar2 = (Type *)operator_new__(uVar3 * 0x18);
      if (this->numActive != 0) {
        lVar4 = 0x10;
        uVar5 = 0;
        do {
          pTVar1 = this->items;
          *(undefined4 *)((long)pTVar2 + lVar4 + -0x10) =
               *(undefined4 *)((long)pTVar1 + lVar4 + -0x10);
          *(undefined4 *)((long)pTVar2 + lVar4 + -0xc) =
               *(undefined4 *)((long)pTVar1 + lVar4 + -0xc);
          *(undefined8 *)((long)pTVar2 + lVar4 + -8) = *(undefined8 *)((long)pTVar1 + lVar4 + -8);
          *(undefined8 *)(&pTVar2->category + lVar4) = *(undefined8 *)(&pTVar1->category + lVar4);
          *(undefined8 *)(&pTVar1->category + lVar4) = 0;
          RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x18;
        } while (uVar5 < this->numActive);
      }
      if (8 < this->numAllocated) {
        if (this->items != (Type *)0x0) {
          operator_delete__(this->items);
        }
        this->items = (Type *)this->space;
        this->numAllocated = 8;
      }
      this->items = pTVar2;
    }
    this->numAllocated = uVar3;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }